

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS
ref_gather_cell_tec(REF_NODE ref_node,REF_CELL ref_cell,REF_LONG ncell_expected,REF_GLOB *l2c,
                   REF_BOOL binary,FILE *file)

{
  long *plVar1;
  REF_LONG RVar2;
  REF_STATUS RVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  void *pvVar8;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  size_t __n;
  char *pcVar12;
  ulong uVar13;
  int iVar14;
  REF_MPI pRVar15;
  REF_INT ncell;
  REF_INT part;
  ulong local_1b8;
  REF_MPI local_1b0;
  REF_NODE local_1a8;
  REF_BOOL local_1a0;
  int local_19c;
  REF_LONG local_198;
  long local_190;
  void *local_188;
  void *local_180;
  REF_INT nodes [27];
  REF_GLOB globals [27];
  
  pRVar15 = ref_node->ref_mpi;
  local_1b8 = (ulong)ref_cell->node_per;
  local_1a8 = ref_node;
  local_1a0 = binary;
  if (1 < pRVar15->timing) {
    ref_mpi_stopwatch_stop(pRVar15,"tet cell start");
  }
  local_1b0 = pRVar15;
  if (pRVar15->id == 0) {
    uVar13 = 0;
    if (0 < (int)local_1b8) {
      uVar13 = local_1b8 & 0xffffffff;
    }
    local_190 = 0;
    local_198 = ncell_expected;
    for (iVar14 = 0; ncell_expected = local_198, iVar14 < ref_cell->max; iVar14 = iVar14 + 1) {
      RVar3 = ref_cell_nodes(ref_cell,iVar14,nodes);
      if (RVar3 == 0) {
        uVar4 = ref_cell_part(ref_cell,local_1a8,iVar14,&part);
        if (uVar4 != 0) {
          pcVar12 = "part";
          uVar10 = 0x16a;
          goto LAB_001510fb;
        }
        if (local_1b0->id == part) {
          for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
            globals[uVar9] = l2c[nodes[uVar9]];
          }
          if (local_1a0 == 0) {
            for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
              globals[uVar9] = globals[uVar9] + 1;
              fprintf((FILE *)file," %ld");
            }
            fputc(10,(FILE *)file);
          }
          else {
            for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
              ncell = (REF_INT)globals[uVar9];
              sVar6 = fwrite(&ncell,4,1,(FILE *)file);
              if (sVar6 != 1) {
                __n = 1;
                uVar10 = 0x173;
                goto LAB_00150d82;
              }
            }
          }
          local_190 = local_190 + 1;
        }
      }
    }
  }
  else {
    local_190 = 0;
  }
  pRVar15 = local_1b0;
  if (1 < local_1b0->timing) {
    ref_mpi_stopwatch_stop(local_1b0,"tet cell master");
  }
  if (pRVar15->id == 0) {
    uVar13 = 0;
    if (0 < (int)local_1b8) {
      uVar13 = local_1b8 & 0xffffffff;
    }
    local_1a8 = (REF_NODE)(local_1b8 << 3);
    iVar14 = 1;
    local_198 = ncell_expected;
    while (pRVar15 = local_1b0, iVar14 < local_1b0->n) {
      local_19c = iVar14;
      uVar4 = ref_mpi_gather_recv(local_1b0,&ncell,1,1,iVar14);
      if (uVar4 != 0) {
        pcVar12 = "recv ncell";
        uVar10 = 0x187;
        goto LAB_001510fb;
      }
      uVar4 = ncell * (int)local_1b8;
      if ((int)uVar4 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x188,"ref_gather_cell_tec","malloc c2n of REF_GLOB negative");
        return 1;
      }
      local_180 = malloc((ulong)uVar4 * 8);
      if (local_180 == (void *)0x0) {
        pcVar12 = "malloc c2n of REF_GLOB NULL";
        uVar10 = 0x188;
        goto LAB_00151032;
      }
      local_188 = malloc((ulong)uVar4 << 2);
      pvVar8 = local_180;
      if (local_188 == (void *)0x0) {
        pcVar12 = "malloc int_c2n of REF_INT NULL";
        uVar10 = 0x189;
        goto LAB_00151032;
      }
      uVar4 = ref_mpi_gather_recv(local_1b0,local_180,uVar4,2,local_19c);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x18c,"ref_gather_cell_tec",(ulong)uVar4,"recv c2n");
        return uVar4;
      }
      uVar4 = ncell * (int)local_1b8;
      uVar9 = 0;
      if (0 < (int)uVar4) {
        uVar9 = (ulong)uVar4;
      }
      if (local_1a0 == 0) {
        for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
          plVar1 = (long *)((long)pvVar8 + uVar5 * 8);
          *plVar1 = *plVar1 + 1;
        }
        for (lVar11 = 0; lVar7 = (long)ncell, lVar11 < lVar7; lVar11 = lVar11 + 1) {
          for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
            fprintf((FILE *)file," %ld",*(undefined8 *)((long)pvVar8 + uVar9 * 8));
          }
          fputc(10,(FILE *)file);
          pvVar8 = (void *)((long)pvVar8 + (long)local_1a8);
        }
      }
      else {
        for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
          *(undefined4 *)((long)local_188 + uVar5 * 4) = *(undefined4 *)((long)pvVar8 + uVar5 * 8);
        }
        __n = (size_t)(int)uVar4;
        sVar6 = fwrite(local_188,4,__n,(FILE *)file);
        if (sVar6 != __n) {
          uVar10 = 0x194;
LAB_00150d82:
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar10,"ref_gather_cell_tec","int c2n",__n,sVar6);
          return 1;
        }
        lVar7 = (long)ncell;
      }
      local_190 = local_190 + lVar7;
      free(local_188);
      free(local_180);
      iVar14 = local_19c + 1;
    }
  }
  else {
    ncell = 0;
    for (iVar14 = 0; iVar14 < ref_cell->max; iVar14 = iVar14 + 1) {
      RVar3 = ref_cell_nodes(ref_cell,iVar14,nodes);
      if (RVar3 == 0) {
        uVar4 = ref_cell_part(ref_cell,local_1a8,iVar14,&part);
        if (uVar4 != 0) {
          pcVar12 = "part";
          uVar10 = 0x1a8;
          goto LAB_001510fb;
        }
        if (local_1b0->id == part) {
          ncell = ncell + 1;
        }
      }
    }
    uVar4 = ref_mpi_gather_send(local_1b0,&ncell,1,1);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x1ab,"ref_gather_cell_tec",(ulong)uVar4,"send ncell");
      return uVar4;
    }
    if (ncell * (int)local_1b8 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x1ac,"ref_gather_cell_tec","malloc c2n of REF_GLOB negative");
      return 1;
    }
    pvVar8 = malloc((ulong)(uint)(ncell * (int)local_1b8) << 3);
    if (pvVar8 == (void *)0x0) {
      pcVar12 = "malloc c2n of REF_GLOB NULL";
      uVar10 = 0x1ac;
LAB_00151032:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar10,"ref_gather_cell_tec",pcVar12);
      return 2;
    }
    ncell = 0;
    iVar14 = 0;
    uVar13 = 0;
    if (0 < (int)local_1b8) {
      uVar13 = local_1b8 & 0xffffffff;
    }
    local_198 = ncell_expected;
    for (; pRVar15 = local_1b0, iVar14 < ref_cell->max; iVar14 = iVar14 + 1) {
      RVar3 = ref_cell_nodes(ref_cell,iVar14,nodes);
      if (RVar3 == 0) {
        uVar4 = ref_cell_part(ref_cell,local_1a8,iVar14,&part);
        if (uVar4 != 0) {
          pcVar12 = "part";
          uVar10 = 0x1af;
          goto LAB_001510fb;
        }
        if (local_1b0->id == part) {
          for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
            *(REF_GLOB *)((long)pvVar8 + uVar9 * 8 + (long)(ncell * (int)local_1b8) * 8) =
                 l2c[nodes[uVar9]];
          }
          ncell = ncell + 1;
        }
      }
    }
    uVar4 = ref_mpi_gather_send(local_1b0,pvVar8,(int)local_1b8 * ncell,2);
    if (uVar4 != 0) {
      pcVar12 = "send c2n";
      uVar10 = 0x1b7;
LAB_001510fb:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar10,"ref_gather_cell_tec",(ulong)uVar4,pcVar12);
      return uVar4;
    }
    free(pvVar8);
  }
  lVar7 = local_190;
  RVar2 = local_198;
  if (1 < pRVar15->timing) {
    ref_mpi_stopwatch_stop(pRVar15,"tet cell off");
  }
  RVar3 = 0;
  if ((pRVar15->id == 0) && (lVar7 != RVar2)) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x1c0,
           "ref_gather_cell_tec","cell count mismatch",RVar2,lVar7);
    RVar3 = 1;
  }
  return RVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_cell_tec(REF_NODE ref_node,
                                              REF_CELL ref_cell,
                                              REF_LONG ncell_expected,
                                              REF_GLOB *l2c, REF_BOOL binary,
                                              FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB globals[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per = ref_cell_node_per(ref_cell);
  REF_GLOB *c2n;
  REF_INT *int_c2n;
  REF_INT proc, part, ncell;
  REF_LONG ncell_actual;

  ncell_actual = 0;

  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "tet cell start");

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        for (node = 0; node < node_per; node++) {
          globals[node] = l2c[nodes[node]];
        }
        if (binary) {
          for (node = 0; node < node_per; node++) {
            int int_node;
            int_node = (int)globals[node]; /* binary zero-based */
            REIS(1, fwrite(&int_node, sizeof(int), 1, file), "int c2n");
          }
        } else {
          for (node = 0; node < node_per; node++) {
            globals[node]++; /* ascii one-based */
            fprintf(file, " " REF_GLOB_FMT, globals[node]);
          }
          fprintf(file, "\n");
        }
        ncell_actual++;
      }
    }
  }

  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "tet cell master");

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell, 1, REF_INT_TYPE, proc),
          "recv ncell");
      ref_malloc(c2n, ncell * node_per, REF_GLOB);
      ref_malloc(int_c2n, ncell * node_per, REF_INT);
      RSS(ref_mpi_gather_recv(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE,
                              proc),
          "recv c2n");

      if (binary) { /* binary 0-based int, ASCII 1-based */
        for (cell = 0; cell < ncell * node_per; cell++) {
          int_c2n[cell] = (REF_INT)c2n[cell];
        }
        REIS(ncell * node_per,
             fwrite(int_c2n, sizeof(int), (size_t)(ncell * node_per), file),
             "int c2n");
      } else {
        for (cell = 0; cell < ncell * node_per; cell++) {
          c2n[cell]++;
        }
        for (cell = 0; cell < ncell; cell++) {
          for (node = 0; node < node_per; node++) {
            fprintf(file, " " REF_GLOB_FMT, c2n[node + node_per * cell]);
          }
          fprintf(file, "\n");
        }
      }
      ncell_actual += ncell;

      ref_free(int_c2n);
      ref_free(c2n);
    }
  } else {
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) ncell++;
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ncell, 1, REF_INT_TYPE), "send ncell");
    ref_malloc(c2n, ncell * node_per, REF_GLOB);
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        for (node = 0; node < node_per; node++)
          c2n[node + node_per * ncell] = l2c[nodes[node]];
        ncell++;
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE),
        "send c2n");

    ref_free(c2n);
  }

  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "tet cell off");

  if (ref_mpi_once(ref_mpi)) {
    REIS(ncell_expected, ncell_actual, "cell count mismatch");
  }

  return REF_SUCCESS;
}